

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O0

int Gia_ManComputeEdgeDelay(Gia_Man_t *p,int fUseTwo)

{
  Tim_Man_t *pTVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pObj_00;
  bool bVar6;
  float fVar7;
  int arrTime_3;
  int arrTime_2;
  Vec_Int_t *vNodes_1;
  Gia_Obj_t *pObj_1;
  int arrTime_1;
  int arrTime;
  Vec_Int_t *vNodes;
  Gia_Obj_t *pObj;
  int DelayMax;
  int iLut;
  int k;
  int fUseTwo_local;
  Gia_Man_t *p_local;
  
  pObj._0_4_ = 0;
  Vec_IntFreeP(&p->vEdgeDelay);
  Vec_IntFreeP(&p->vEdge1);
  Vec_IntFreeP(&p->vEdge2);
  iVar3 = Gia_ManObjNum(p);
  pVVar5 = Vec_IntStart(iVar3);
  p->vEdge1 = pVVar5;
  iVar3 = Gia_ManObjNum(p);
  pVVar5 = Vec_IntStart(iVar3);
  p->vEdge2 = pVVar5;
  iVar3 = Gia_ManObjNum(p);
  pVVar5 = Vec_IntStart(iVar3);
  p->vEdgeDelay = pVVar5;
  iVar3 = Gia_ManHasMapping(p);
  if (iVar3 == 0) {
    iVar3 = Gia_ManHasMapping2(p);
    if (iVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                    ,0x1d7,"int Gia_ManComputeEdgeDelay(Gia_Man_t *, int)");
    }
    if ((p->pManTime == (void *)0x0) ||
       (iVar3 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar3 == 0)) {
      for (pObj._4_4_ = 1; iVar3 = Gia_ManObjNum(p), pObj._4_4_ < iVar3; pObj._4_4_ = pObj._4_4_ + 1
          ) {
        iVar3 = Gia_ObjIsLut2(p,pObj._4_4_);
        if (iVar3 != 0) {
          Gia_ObjComputeEdgeDelay(p,pObj._4_4_,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
        }
      }
    }
    else {
      pVVar5 = Gia_ManOrderWithBoxes(p);
      Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
      DelayMax = 0;
      while( true ) {
        iVar3 = Vec_IntSize(pVVar5);
        bVar6 = false;
        if (DelayMax < iVar3) {
          iVar3 = Vec_IntEntry(pVVar5,DelayMax);
          vNodes_1 = (Vec_Int_t *)Gia_ManObj(p,iVar3);
          bVar6 = vNodes_1 != (Vec_Int_t *)0x0;
        }
        if (!bVar6) break;
        iVar3 = Gia_ObjId(p,(Gia_Obj_t *)vNodes_1);
        iVar4 = Gia_ObjIsAnd((Gia_Obj_t *)vNodes_1);
        if (iVar4 == 0) {
          iVar4 = Gia_ObjIsCi((Gia_Obj_t *)vNodes_1);
          if (iVar4 == 0) {
            iVar4 = Gia_ObjIsCo((Gia_Obj_t *)vNodes_1);
            if (iVar4 == 0) {
              iVar3 = Gia_ObjIsConst0((Gia_Obj_t *)vNodes_1);
              if (iVar3 == 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                              ,0x1cd,"int Gia_ManComputeEdgeDelay(Gia_Man_t *, int)");
              }
            }
            else {
              pVVar2 = p->vEdgeDelay;
              iVar3 = Gia_ObjFaninId0((Gia_Obj_t *)vNodes_1,iVar3);
              iVar3 = Vec_IntEntry(pVVar2,iVar3);
              pTVar1 = (Tim_Man_t *)p->pManTime;
              iVar4 = Gia_ObjCioId((Gia_Obj_t *)vNodes_1);
              Tim_ManSetCoArrival(pTVar1,iVar4,(float)iVar3);
            }
          }
          else {
            pTVar1 = (Tim_Man_t *)p->pManTime;
            iVar4 = Gia_ObjCioId((Gia_Obj_t *)vNodes_1);
            fVar7 = Tim_ManGetCiArrival(pTVar1,iVar4);
            Vec_IntWriteEntry(p->vEdgeDelay,iVar3,(int)fVar7);
          }
        }
        else {
          iVar4 = Gia_ObjIsLut2(p,iVar3);
          if (iVar4 != 0) {
            Gia_ObjComputeEdgeDelay(p,iVar3,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
          }
        }
        DelayMax = DelayMax + 1;
      }
      Vec_IntFree(pVVar5);
    }
  }
  else if ((p->pManTime == (void *)0x0) ||
          (iVar3 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar3 == 0)) {
    for (pObj._4_4_ = 1; iVar3 = Gia_ManObjNum(p), pObj._4_4_ < iVar3; pObj._4_4_ = pObj._4_4_ + 1)
    {
      iVar3 = Gia_ObjIsLut(p,pObj._4_4_);
      if (iVar3 != 0) {
        Gia_ObjComputeEdgeDelay(p,pObj._4_4_,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
      }
    }
  }
  else {
    pVVar5 = Gia_ManOrderWithBoxes(p);
    Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
    DelayMax = 0;
    while( true ) {
      iVar3 = Vec_IntSize(pVVar5);
      bVar6 = false;
      if (DelayMax < iVar3) {
        iVar3 = Vec_IntEntry(pVVar5,DelayMax);
        vNodes = (Vec_Int_t *)Gia_ManObj(p,iVar3);
        bVar6 = vNodes != (Vec_Int_t *)0x0;
      }
      if (!bVar6) break;
      iVar3 = Gia_ObjId(p,(Gia_Obj_t *)vNodes);
      iVar4 = Gia_ObjIsAnd((Gia_Obj_t *)vNodes);
      if (iVar4 == 0) {
        iVar4 = Gia_ObjIsCi((Gia_Obj_t *)vNodes);
        if (iVar4 == 0) {
          iVar4 = Gia_ObjIsCo((Gia_Obj_t *)vNodes);
          if (iVar4 == 0) {
            iVar3 = Gia_ObjIsConst0((Gia_Obj_t *)vNodes);
            if (iVar3 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                            ,0x1a9,"int Gia_ManComputeEdgeDelay(Gia_Man_t *, int)");
            }
          }
          else {
            pVVar2 = p->vEdgeDelay;
            iVar3 = Gia_ObjFaninId0((Gia_Obj_t *)vNodes,iVar3);
            iVar3 = Vec_IntEntry(pVVar2,iVar3);
            pTVar1 = (Tim_Man_t *)p->pManTime;
            iVar4 = Gia_ObjCioId((Gia_Obj_t *)vNodes);
            Tim_ManSetCoArrival(pTVar1,iVar4,(float)iVar3);
          }
        }
        else {
          pTVar1 = (Tim_Man_t *)p->pManTime;
          iVar4 = Gia_ObjCioId((Gia_Obj_t *)vNodes);
          fVar7 = Tim_ManGetCiArrival(pTVar1,iVar4);
          Vec_IntWriteEntry(p->vEdgeDelay,iVar3,(int)fVar7);
        }
      }
      else {
        iVar4 = Gia_ObjIsLut(p,iVar3);
        if (iVar4 != 0) {
          Gia_ObjComputeEdgeDelay(p,iVar3,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
        }
      }
      DelayMax = DelayMax + 1;
    }
    Vec_IntFree(pVVar5);
  }
  for (DelayMax = 0; iVar3 = Vec_IntSize(p->vCos), DelayMax < iVar3; DelayMax = DelayMax + 1) {
    pObj_00 = Gia_ManCo(p,DelayMax);
    iVar3 = Gia_ObjFaninId0p(p,pObj_00);
    iVar3 = Vec_IntEntry(p->vEdgeDelay,iVar3);
    pObj._0_4_ = Abc_MaxInt((int)pObj,iVar3);
  }
  return (int)pObj;
}

Assistant:

int Gia_ManComputeEdgeDelay( Gia_Man_t * p, int fUseTwo )
{
    int k, iLut, DelayMax = 0;
    Vec_IntFreeP( &p->vEdgeDelay );
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdgeDelay = Vec_IntStart( Gia_ManObjNum(p) );
    if ( Gia_ManHasMapping(p) )
    {
        if ( p->pManTime != NULL && Tim_ManBoxNum((Tim_Man_t*)p->pManTime) )
        {
            Gia_Obj_t * pObj; 
            Vec_Int_t * vNodes = Gia_ManOrderWithBoxes( p );
            Tim_ManIncrementTravId( (Tim_Man_t*)p->pManTime );
            Gia_ManForEachObjVec( vNodes, p, pObj, k )
            {
                iLut = Gia_ObjId( p, pObj );
                if ( Gia_ObjIsAnd(pObj) )
                {
                    if ( Gia_ObjIsLut(p, iLut) )
                        Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
                }
                else if ( Gia_ObjIsCi(pObj) )
                {
                    int arrTime = Tim_ManGetCiArrival( (Tim_Man_t*)p->pManTime, Gia_ObjCioId(pObj) );
                    Vec_IntWriteEntry( p->vEdgeDelay,  iLut, arrTime );
                }
                else if ( Gia_ObjIsCo(pObj) )
                {
                    int arrTime = Vec_IntEntry( p->vEdgeDelay, Gia_ObjFaninId0(pObj, iLut) );
                    Tim_ManSetCoArrival( (Tim_Man_t*)p->pManTime, Gia_ObjCioId(pObj), arrTime );
                }
                else if ( !Gia_ObjIsConst0(pObj) ) 
                    assert( 0 );
            }
            Vec_IntFree( vNodes );
        }
        else
        {
            Gia_ManForEachLut( p, iLut )
                Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
        }
    }
    else if ( Gia_ManHasMapping2(p) )
    {
        if ( p->pManTime != NULL && Tim_ManBoxNum((Tim_Man_t*)p->pManTime) )
        {
            Gia_Obj_t * pObj; 
            Vec_Int_t * vNodes = Gia_ManOrderWithBoxes( p );
            Tim_ManIncrementTravId( (Tim_Man_t*)p->pManTime );
            Gia_ManForEachObjVec( vNodes, p, pObj, k )
            {
                iLut = Gia_ObjId( p, pObj );
                if ( Gia_ObjIsAnd(pObj) )
                {
                    if ( Gia_ObjIsLut2(p, iLut) )
                        Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
                }
                else if ( Gia_ObjIsCi(pObj) )
                {
                    int arrTime = Tim_ManGetCiArrival( (Tim_Man_t*)p->pManTime, Gia_ObjCioId(pObj) );
                    Vec_IntWriteEntry( p->vEdgeDelay,  iLut, arrTime );
                }
                else if ( Gia_ObjIsCo(pObj) )
                {
                    int arrTime = Vec_IntEntry( p->vEdgeDelay, Gia_ObjFaninId0(pObj, iLut) );
                    Tim_ManSetCoArrival( (Tim_Man_t*)p->pManTime, Gia_ObjCioId(pObj), arrTime );
                }
                else if ( !Gia_ObjIsConst0(pObj) ) 
                    assert( 0 );
            }
            Vec_IntFree( vNodes );
        }
        else
        {
            Gia_ManForEachLut2( p, iLut )
                Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
        }
    }
    else assert( 0 );
    Gia_ManForEachCoDriverId( p, iLut, k )
        DelayMax = Abc_MaxInt( DelayMax, Vec_IntEntry(p->vEdgeDelay, iLut) );
    //printf( "The number of edges = %d.  Delay = %d.\n", Gia_ManEvalEdgeCount(p), DelayMax );
    return DelayMax;
}